

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O0

void __thiscall
Assimp::DXFImporter::ExpandBlockReferences(DXFImporter *this,Block *bl,BlockMap *blocks_by_name)

{
  Block *this_00;
  bool bVar1;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_01;
  basic_formatter *this_02;
  reference ppVar2;
  reference __r;
  PolyLine *this_03;
  element_type *peVar3;
  aiMatrix4x4t<float> *paVar4;
  Logger *pLVar5;
  element_type *this_04;
  reference this_05;
  float fVar6;
  aiVector3t<float> aVar7;
  aiVector3D *v;
  iterator __end4;
  iterator __begin4;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *__range4;
  aiVector3t<float> local_2c8;
  undefined1 local_2b8 [8];
  aiMatrix4x4 tmp;
  aiMatrix4x4 trafo;
  shared_ptr<Assimp::DXF::PolyLine> pl_out;
  shared_ptr<const_Assimp::DXF::PolyLine> pl_in;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  *__range2;
  Block *bl_src;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_70;
  _Self local_50;
  _Self local_48;
  const_iterator it;
  InsertBlock *insert;
  iterator __end1;
  iterator __begin1;
  vector<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_> *__range1;
  BlockMap *blocks_by_name_local;
  Block *bl_local;
  DXFImporter *this_local;
  
  __end1 = std::vector<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>::begin
                     (&bl->insertions);
  insert = (InsertBlock *)
           std::vector<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>::end
                     (&bl->insertions);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Assimp::DXF::InsertBlock_*,_std::vector<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>_>
                                *)&insert);
    if (!bVar1) {
      return;
    }
    it._M_node = (_Base_ptr)
                 __gnu_cxx::
                 __normal_iterator<Assimp::DXF::InsertBlock_*,_std::vector<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>_>
                 ::operator*(&__end1);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
         ::find(blocks_by_name,&((reference)it._M_node)->name);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
         ::end(blocks_by_name);
    bVar1 = std::operator==(&local_48,&local_50);
    if (bVar1) {
      pLVar5 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[41]>
                (&local_1e8,(char (*) [41])"DXF: Failed to resolve block reference: ");
      this_01 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_1e8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (it._M_node + 1));
      this_02 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(this_01,(char (*) [11])0xb6cd0e);
      Formatter::basic_formatter::operator_cast_to_string(&local_70,this_02);
      Logger::error(pLVar5,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_1e8);
    }
    else {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>
               ::operator*(&local_48);
      this_00 = ppVar2->second;
      __end2 = std::
               vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
               ::begin(&this_00->lines);
      pl_in.super___shared_ptr<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              std::
              vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
              ::end(&this_00->lines);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_std::shared_ptr<Assimp::DXF::PolyLine>_*,_std::vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>_>
                                         *)&pl_in.
                                            super___shared_ptr<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount), bVar1) {
        __r = __gnu_cxx::
              __normal_iterator<const_std::shared_ptr<Assimp::DXF::PolyLine>_*,_std::vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>_>
              ::operator*(&__end2);
        std::shared_ptr<Assimp::DXF::PolyLine_const>::shared_ptr<Assimp::DXF::PolyLine,void>
                  ((shared_ptr<Assimp::DXF::PolyLine_const> *)
                   &pl_out.super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,__r);
        this_03 = (PolyLine *)operator_new(0xa8);
        peVar3 = std::
                 __shared_ptr_access<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&pl_out.
                                 super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
        DXF::PolyLine::PolyLine(this_03,peVar3);
        std::shared_ptr<Assimp::DXF::PolyLine>::shared_ptr<Assimp::DXF::PolyLine,void>
                  ((shared_ptr<Assimp::DXF::PolyLine> *)&trafo.d3,this_03);
        fVar6 = aiVector3t<float>::Length(&this_00->base);
        if (((((((fVar6 != 0.0) || (NAN(fVar6))) ||
               (fVar6 = *(float *)((long)&(it._M_node)->_M_parent + 4), fVar6 != 1.0)) ||
              ((NAN(fVar6) || (*(float *)&(it._M_node)->_M_left != 1.0)))) ||
             ((NAN(*(float *)&(it._M_node)->_M_left) ||
              ((fVar6 = *(float *)((long)&(it._M_node)->_M_left + 4), fVar6 != 1.0 || (NAN(fVar6))))
              ))) || (*(float *)&(it._M_node)->_M_right != 0.0)) ||
           (NAN(*(float *)&(it._M_node)->_M_right))) {
LAB_00688cd2:
          aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&tmp.d3);
          aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_2b8);
          aVar7 = ::operator-(&this_00->base);
          local_2c8.z = aVar7.z;
          local_2c8._0_8_ = aVar7._0_8_;
          aiMatrix4x4t<float>::Translation(&local_2c8,(aiMatrix4x4t<float> *)&tmp.d3);
          paVar4 = aiMatrix4x4t<float>::Scaling
                             ((aiVector3t<float> *)((long)&(it._M_node)->_M_parent + 4),
                              (aiMatrix4x4t<float> *)local_2b8);
          aiMatrix4x4t<float>::operator*=((aiMatrix4x4t<float> *)&tmp.d3,paVar4);
          paVar4 = aiMatrix4x4t<float>::Translation
                             ((aiVector3t<float> *)it._M_node,(aiMatrix4x4t<float> *)local_2b8);
          aiMatrix4x4t<float>::operator*=((aiMatrix4x4t<float> *)&tmp.d3,paVar4);
          if ((*(float *)&(it._M_node)->_M_right != 0.0) || (NAN(*(float *)&(it._M_node)->_M_right))
             ) {
            pLVar5 = DefaultLogger::get();
            Logger::warn(pLVar5,"DXF: BLOCK rotation not currently implemented");
          }
          this_04 = std::
                    __shared_ptr_access<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&trafo.d3);
          __end4 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                             (&this_04->positions);
          v = (aiVector3D *)
              std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                        (&this_04->positions);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                                             *)&v), bVar1) {
            this_05 = __gnu_cxx::
                      __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                      ::operator*(&__end4);
            aiVector3t<float>::operator*=(this_05,(aiMatrix4x4t<float> *)&tmp.d3);
            __gnu_cxx::
            __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
            ::operator++(&__end4);
          }
        }
        else {
          fVar6 = aiVector3t<float>::Length((aiVector3t<float> *)it._M_node);
          if ((fVar6 != 0.0) || (NAN(fVar6))) goto LAB_00688cd2;
        }
        std::
        vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
        ::push_back(&bl->lines,(value_type *)&trafo.d3);
        std::shared_ptr<Assimp::DXF::PolyLine>::~shared_ptr
                  ((shared_ptr<Assimp::DXF::PolyLine> *)&trafo.d3);
        std::shared_ptr<const_Assimp::DXF::PolyLine>::~shared_ptr
                  ((shared_ptr<const_Assimp::DXF::PolyLine> *)
                   &pl_out.super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<Assimp::DXF::PolyLine>_*,_std::vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>_>
        ::operator++(&__end2);
      }
    }
    __gnu_cxx::
    __normal_iterator<Assimp::DXF::InsertBlock_*,_std::vector<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void DXFImporter::ExpandBlockReferences(DXF::Block& bl,const DXF::BlockMap& blocks_by_name) {
    for (const DXF::InsertBlock& insert : bl.insertions) {

        // first check if the referenced blocks exists ...
        const DXF::BlockMap::const_iterator it = blocks_by_name.find(insert.name);
        if (it == blocks_by_name.end()) {
            ASSIMP_LOG_ERROR_F("DXF: Failed to resolve block reference: ", insert.name,"; skipping" );
            continue;
        }

        // XXX this would be the place to implement recursive expansion if needed.
        const DXF::Block& bl_src = *(*it).second;

        for (std::shared_ptr<const DXF::PolyLine> pl_in : bl_src.lines) {
            std::shared_ptr<DXF::PolyLine> pl_out = std::shared_ptr<DXF::PolyLine>(new DXF::PolyLine(*pl_in));

            if (bl_src.base.Length() || insert.scale.x!=1.f || insert.scale.y!=1.f || insert.scale.z!=1.f || insert.angle || insert.pos.Length()) {
                // manual coordinate system transformation
                // XXX order
                aiMatrix4x4 trafo, tmp;
                aiMatrix4x4::Translation(-bl_src.base,trafo);
                trafo *= aiMatrix4x4::Scaling(insert.scale,tmp);
                trafo *= aiMatrix4x4::Translation(insert.pos,tmp);

                // XXX rotation currently ignored - I didn't find an appropriate sample model.
                if (insert.angle != 0.f) {
                    ASSIMP_LOG_WARN("DXF: BLOCK rotation not currently implemented");
                }

                for (aiVector3D& v : pl_out->positions) {
                    v *= trafo;
                }
            }

            bl.lines.push_back(pl_out);
        }
    }
}